

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

UninterpretedOption_NamePart *
google::protobuf::Arena::CreateMessageInternal<google::protobuf::UninterpretedOption_NamePart>
          (Arena *arena)

{
  UninterpretedOption_NamePart *pUVar1;
  
  if (arena != (Arena *)0x0) {
    pUVar1 = DoCreateMessage<google::protobuf::UninterpretedOption_NamePart>(arena);
    return pUVar1;
  }
  pUVar1 = (UninterpretedOption_NamePart *)operator_new(0x28);
  UninterpretedOption_NamePart::UninterpretedOption_NamePart(pUVar1,(Arena *)0x0,false);
  return pUVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }